

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O2

void __thiscall bandit::reporter::info::list_failures_and_errors(info *this)

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar1;
  ostream *poVar2;
  _List_node_base *p_Var3;
  iterator __end3;
  string local_70 [32];
  string local_50 [32];
  
  if (0 < (this->super_colored_base).super_progress_base.specs_failed_) {
    poVar2 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(local_70);
    poVar2 = std::operator<<(poVar2,local_70);
    poVar2 = std::operator<<(poVar2,"List of failures:");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string(local_70);
    plVar1 = &(this->super_colored_base).super_progress_base.failures_;
    p_Var3 = (_List_node_base *)plVar1;
    while (p_Var3 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var3 != (_List_node_base *)plVar1) {
      poVar2 = (this->super_colored_base).stm_;
      (*((this->super_colored_base).colorizer_)->_vptr_interface[6])(local_70);
      poVar2 = std::operator<<(poVar2,local_70);
      poVar2 = std::operator<<(poVar2," (*) ");
      (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(local_50);
      poVar2 = std::operator<<(poVar2,local_50);
      poVar2 = std::operator<<(poVar2,(string *)(p_Var3 + 1));
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string(local_70);
    }
  }
  if ((this->super_colored_base).super_progress_base.test_run_errors_.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size != 0) {
    poVar2 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(local_70);
    poVar2 = std::operator<<(poVar2,local_70);
    poVar2 = std::operator<<(poVar2,"List of run errors:");
    std::endl<char,std::char_traits<char>>(poVar2);
    plVar1 = &(this->super_colored_base).super_progress_base.test_run_errors_;
    std::__cxx11::string::~string(local_70);
    p_Var3 = (_List_node_base *)plVar1;
    while (p_Var3 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var3 != (_List_node_base *)plVar1) {
      poVar2 = (this->super_colored_base).stm_;
      (*((this->super_colored_base).colorizer_)->_vptr_interface[6])(local_70);
      poVar2 = std::operator<<(poVar2,local_70);
      poVar2 = std::operator<<(poVar2," (*) ");
      (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(local_50);
      poVar2 = std::operator<<(poVar2,local_50);
      poVar2 = std::operator<<(poVar2,(string *)(p_Var3 + 1));
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string(local_70);
    }
  }
  return;
}

Assistant:

void list_failures_and_errors() {
        if (specs_failed_ > 0) {
          stm_
              << colorizer_.bad()
              << "List of failures:"
              << std::endl;
          for (const auto& failure : failures_) {
            stm_
                << colorizer_.emphasize()
                << " (*) "
                << colorizer_.bad()
                << failure << std::endl;
          }
        }
        if (test_run_errors_.size() > 0) {
          stm_
              << colorizer_.bad()
              << "List of run errors:"
              << std::endl;
          for (const auto& error : test_run_errors_) {
            stm_
                << colorizer_.emphasize()
                << " (*) "
                << colorizer_.bad()
                << error << std::endl;
          }
        }
      }